

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void error<String,int,String,String>
               (char *fmtstr,String *args,int *args_1,String *args_2,String *args_3)

{
  allocator local_69;
  String local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  std::__cxx11::string::string((string *)local_48,fmtstr,&local_69);
  format<String,int,String,String>(&local_68,(String *)local_48,args,args_1,args_2,args_3);
  error(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._string._M_dataplus._M_p != &local_68._string.field_2) {
    operator_delete(local_68._string._M_dataplus._M_p);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

void error (const char* fmtstr, const argtypes&... args)
{
	error (format (String (fmtstr), args...));
}